

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O3

TestBaseType *
chaiscript::boxed_cast<TestBaseType*>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  TestBaseType *pTVar1;
  element_type *peVar2;
  type_info *ptVar3;
  type_info *ptVar4;
  bool bVar5;
  undefined8 *puVar6;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  Boxed_Value BVar7;
  undefined1 local_78 [16];
  uint local_68;
  undefined4 uStack_64;
  pointer_____offset_0x10___ *local_58;
  pointer_____offset_0x10___ *local_50;
  undefined4 local_48;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_78._0_8_ = &TestBaseType*::typeinfo;
    local_78._8_8_ = &TestBaseType::typeinfo;
    local_68 = 4;
    bVar5 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_78);
    in_RDX = extraout_RDX;
    if ((!bVar5) &&
       (bVar5 = Type_Conversions::convertable_type<TestBaseType*>
                          ((t_conversions->m_conversions)._M_data), in_RDX = extraout_RDX_00, bVar5)
       ) {
      bVar5 = Type_Conversions::convertable_type<TestBaseType*>
                        ((t_conversions->m_conversions)._M_data);
      if (!bVar5) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
        peVar2 = (bv->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_68 = (peVar2->m_type_info).m_flags;
        uStack_64 = *(undefined4 *)&(peVar2->m_type_info).field_0x14;
        ptVar3 = (peVar2->m_type_info).m_type_info;
        ptVar4 = (peVar2->m_type_info).m_bare_type_info;
        *puVar6 = &PTR__bad_cast_00175ad8;
        local_78._0_4_ = SUB84(ptVar3,0);
        local_78._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
        local_78._8_4_ = SUB84(ptVar4,0);
        local_78._12_4_ = (undefined4)((ulong)ptVar4 >> 0x20);
        *(undefined4 *)(puVar6 + 1) = local_78._0_4_;
        *(undefined4 *)((long)puVar6 + 0xc) = local_78._4_4_;
        *(undefined4 *)(puVar6 + 2) = local_78._8_4_;
        *(undefined4 *)((long)puVar6 + 0x14) = local_78._12_4_;
        puVar6[3] = _local_68;
        puVar6[4] = &TestBaseType*::typeinfo;
        puVar6[5] = 0x19;
        puVar6[6] = "Cannot perform boxed_cast";
        local_78._0_8_ = ptVar3;
        local_78._8_8_ = ptVar4;
        __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_58 = &TestBaseType*::typeinfo;
      local_50 = &TestBaseType::typeinfo;
      local_48 = 4;
      BVar7 = Type_Conversions::boxed_type_conversion
                        ((Type_Conversions *)local_78,
                         (Type_Info *)(t_conversions->m_conversions)._M_data,
                         (Conversion_Saves *)&local_58,
                         (Boxed_Value *)(t_conversions->m_saves)._M_data);
      pTVar1 = *(TestBaseType **)(local_78._0_8_ + 0x20);
      detail::verify_type_no_throw<void>
                ((Boxed_Value *)local_78._0_8_,(type_info *)&TestBaseType::typeinfo,
                 BVar7.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return pTVar1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
      return pTVar1;
    }
  }
  peVar2 = (bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pTVar1 = (TestBaseType *)peVar2->m_data_ptr;
  detail::verify_type_no_throw<void>
            ((Boxed_Value *)peVar2,(type_info *)&TestBaseType::typeinfo,in_RDX);
  return pTVar1;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }